

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::Detail::
rangeToString<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
          (string *__return_storage_ptr__,Detail *this,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> last)

{
  Detail *e;
  ReusableStringStream rss;
  ReusableStringStream local_60;
  string local_48;
  
  ReusableStringStream::ReusableStringStream(&local_60);
  std::operator<<((ostream *)local_60.m_oss,"{ ");
  if (this != (Detail *)first._M_current) {
    stringify<int>(&local_48,(int *)this);
    std::operator<<((ostream *)local_60.m_oss,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    for (e = this + 4; e != (Detail *)first._M_current; e = e + 4) {
      std::operator<<((ostream *)local_60.m_oss,", ");
      stringify<int>(&local_48,(int *)e);
      std::operator<<((ostream *)local_60.m_oss,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  std::operator<<((ostream *)local_60.m_oss," }");
  ReusableStringStream::str_abi_cxx11_((string *)__return_storage_ptr__,&local_60);
  ReusableStringStream::~ReusableStringStream(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }